

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_strategies.cpp
# Opt level: O0

void __thiscall Clasp::BasicSatConfig::prepare(BasicSatConfig *this,SharedContext *ctx)

{
  size_type sVar1;
  size_type sVar2;
  uint32 uVar3;
  reference pSVar4;
  reference pSVar5;
  SharedContext *in_RSI;
  long in_RDI;
  uint32 mod;
  uint32 end;
  uint32 i;
  uint32 warn;
  undefined1 in_stack_ffffffffffffffcf;
  reference in_stack_ffffffffffffffd0;
  size_type n;
  uint uVar6;
  
  uVar6 = 0;
  n = 0;
  sVar1 = bk_lib::pod_vector<Clasp::SolverParams,_std::allocator<Clasp::SolverParams>_>::size
                    ((pod_vector<Clasp::SolverParams,_std::allocator<Clasp::SolverParams>_> *)
                     (in_RDI + 0x18));
  sVar2 = bk_lib::pod_vector<Clasp::SolveParams,_std::allocator<Clasp::SolveParams>_>::size
                    ((pod_vector<Clasp::SolveParams,_std::allocator<Clasp::SolveParams>_> *)
                     (in_RDI + 0x28));
  for (; n != sVar1; n = n + 1) {
    bk_lib::pod_vector<Clasp::SolverParams,_std::allocator<Clasp::SolverParams>_>::operator[]
              ((pod_vector<Clasp::SolverParams,_std::allocator<Clasp::SolverParams>_> *)
               (in_RDI + 0x18),n);
    uVar3 = SolverParams::prepare((SolverParams *)in_stack_ffffffffffffffd0);
    uVar6 = uVar3 | uVar6;
    in_stack_ffffffffffffffd0 =
         bk_lib::pod_vector<Clasp::SolveParams,_std::allocator<Clasp::SolveParams>_>::operator[]
                   ((pod_vector<Clasp::SolveParams,_std::allocator<Clasp::SolveParams>_> *)
                    (in_RDI + 0x28),n % sVar2);
    bk_lib::pod_vector<Clasp::SolverParams,_std::allocator<Clasp::SolverParams>_>::operator[]
              ((pod_vector<Clasp::SolverParams,_std::allocator<Clasp::SolverParams>_> *)
               (in_RDI + 0x18),n);
    uVar3 = SolveParams::prepare(in_stack_ffffffffffffffd0,(bool)in_stack_ffffffffffffffcf);
    uVar6 = uVar3 | uVar6;
    pSVar4 = bk_lib::pod_vector<Clasp::SolverParams,_std::allocator<Clasp::SolverParams>_>::
             operator[]((pod_vector<Clasp::SolverParams,_std::allocator<Clasp::SolverParams>_> *)
                        (in_RDI + 0x18),n);
    if (((ulong)pSVar4->super_SolverStrategies >> 0x27 & 3) == 0) {
      pSVar5 = bk_lib::pod_vector<Clasp::SolveParams,_std::allocator<Clasp::SolveParams>_>::
               operator[]((pod_vector<Clasp::SolveParams,_std::allocator<Clasp::SolveParams>_> *)
                          (in_RDI + 0x28),n % sVar2);
      if (((uint)(pSVar5->reduce).strategy & 0x7f) != 0) {
        uVar6 = uVar6 | 8;
      }
    }
  }
  if ((uVar6 & 1) != 0) {
    SharedContext::warn(in_RSI,(char *)CONCAT44(uVar6,n));
  }
  if ((uVar6 & 2) != 0) {
    SharedContext::warn(in_RSI,(char *)CONCAT44(uVar6,n));
  }
  if ((uVar6 & 4) != 0) {
    SharedContext::warn(in_RSI,(char *)CONCAT44(uVar6,n));
  }
  if ((uVar6 & 8) != 0) {
    SharedContext::warn(in_RSI,(char *)CONCAT44(uVar6,n));
  }
  return;
}

Assistant:

void BasicSatConfig::prepare(SharedContext& ctx) {
	uint32 warn = 0;
	for (uint32 i = 0, end = solver_.size(), mod = search_.size(); i != end; ++i) {
		warn |= solver_[i].prepare();
		warn |= search_[i%mod].prepare(solver_[i].search != SolverStrategies::no_learning);
		if (solver_[i].updateLbd == SolverStrategies::lbd_fixed && search_[i%mod].reduce.strategy.protect) { warn |= 8; }
	}
	if ((warn & 1) != 0) { ctx.warn("Selected heuristic requires lookback strategy!"); }
	if ((warn & 2) != 0) { ctx.warn("Heuristic 'Unit' implies lookahead. Using 'atom'."); }
	if ((warn & 4) != 0) { ctx.warn("Domain options require heuristic 'Domain'!"); }
	if ((warn & 8) != 0) { ctx.warn("Deletion protection requires LBD updates, which are off!"); }
}